

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenTableAccessor
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  GenReceiver(this,struct_def,code_ptr);
  std::__cxx11::string::operator+=((string *)code_ptr," Table() flatbuffers.Table ");
  std::__cxx11::string::operator+=((string *)code_ptr,"{\n");
  if ((struct_def->fixed & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)code_ptr,"\treturn rcv._tab\n");
  }
  else {
    std::__cxx11::string::operator+=((string *)code_ptr,"\treturn rcv._tab.Table\n");
  }
  std::__cxx11::string::operator+=((string *)code_ptr,"}\n\n");
  return;
}

Assistant:

void GenTableAccessor(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    GenReceiver(struct_def, code_ptr);
    code += " Table() flatbuffers.Table ";
    code += "{\n";

    if (struct_def.fixed) {
      code += "\treturn rcv._tab.Table\n";
    } else {
      code += "\treturn rcv._tab\n";
    }
    code += "}\n\n";
  }